

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O1

void __thiscall
GreaterEquation::genPattern
          (GreaterEquation *this,vector<TokenPattern,_std::allocator<TokenPattern>_> *ops)

{
  TokenPattern *this_00;
  PatternExpression *pPVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  ulong uVar7;
  LowlevelError *this_01;
  pointer ppTVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  vector<long,_std::allocator<long>_> cur;
  vector<long,_std::allocator<long>_> min;
  vector<long,_std::allocator<long>_> max;
  vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_> semval;
  vector<long,_std::allocator<long>_> local_118;
  long local_f8;
  TokenPattern local_f0;
  vector<long,_std::allocator<long>_> local_c8;
  long *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  long local_90;
  long local_88;
  long local_80;
  vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_> local_78;
  TokenPattern local_58;
  undefined4 extraout_var_01;
  
  iVar4 = (*(((this->super_ValExpressEquation).lhs)->super_PatternExpression).
            _vptr_PatternExpression[10])();
  iVar5 = (*(((this->super_ValExpressEquation).lhs)->super_PatternExpression).
            _vptr_PatternExpression[0xb])();
  local_f8 = CONCAT44(extraout_var_00,iVar5);
  local_78.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_98 = 0;
  local_a8 = (long *)0x0;
  uStack_a0 = 0;
  local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (long *)0x0;
  local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (*((this->super_ValExpressEquation).rhs)->_vptr_PatternExpression[4])();
  pPVar1 = (this->super_ValExpressEquation).rhs;
  (*pPVar1->_vptr_PatternExpression[5])(pPVar1,&local_c8,&local_a8);
  std::vector<long,_std::allocator<long>_>::operator=(&local_118,&local_c8);
  this_00 = &(this->super_ValExpressEquation).super_PatternEquation.resultpattern;
  lVar11 = local_f8 + 1;
  iVar5 = 0;
  local_90 = CONCAT44(extraout_var,iVar4);
  local_88 = lVar11;
LAB_0032ed8a:
  do {
    lVar10 = local_90;
    pPVar1 = (this->super_ValExpressEquation).rhs;
    local_f0.pattern = (Pattern *)((ulong)local_f0.pattern & 0xffffffff00000000);
    iVar4 = (*pPVar1->_vptr_PatternExpression[6])(pPVar1,&local_118,&local_f0);
    lVar6 = CONCAT44(extraout_var_01,iVar4);
    lVar3 = lVar6;
    if (lVar10 <= local_f8) {
      do {
        local_80 = lVar3;
        if (lVar6 < lVar10) {
          if (iVar5 == 0) {
            buildPattern(&local_f0,(this->super_ValExpressEquation).lhs,lVar10,&local_78,&local_118)
            ;
            TokenPattern::operator=(this_00,&local_f0);
            ppTVar8 = local_f0.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl
                      .super__Vector_impl_data._M_start;
            if (local_f0.pattern != (Pattern *)0x0) {
              (*(local_f0.pattern)->_vptr_Pattern[1])();
              ppTVar8 = local_f0.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            }
          }
          else {
            buildPattern(&local_58,(this->super_ValExpressEquation).lhs,lVar10,&local_78,&local_118)
            ;
            TokenPattern::doOr(&local_f0,this_00,&local_58);
            TokenPattern::operator=(this_00,&local_f0);
            if (local_f0.pattern != (Pattern *)0x0) {
              (*(local_f0.pattern)->_vptr_Pattern[1])();
            }
            if (local_f0.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_f0.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            ppTVar8 = local_58.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl
                      .super__Vector_impl_data._M_start;
            if (local_58.pattern != (Pattern *)0x0) {
              (*(local_58.pattern)->_vptr_Pattern[1])();
              ppTVar8 = local_58.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            }
          }
          if (ppTVar8 != (pointer)0x0) {
            operator_delete(ppTVar8);
          }
          iVar5 = iVar5 + 1;
          lVar6 = local_80;
          lVar11 = local_88;
        }
        lVar10 = lVar10 + 1;
        lVar3 = local_80;
      } while (lVar11 != lVar10);
    }
    bVar12 = (long)local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start != 0;
    if (bVar12) {
      uVar7 = (long)local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      lVar10 = *local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      *local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_start = lVar10 + 1;
      if (lVar10 < *local_a8) goto LAB_0032ed8a;
      uVar2 = 1;
      do {
        uVar9 = uVar2;
        local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9 - 1] =
             local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9 - 1];
        if (uVar7 + (uVar7 == 0) == uVar9) break;
        lVar10 = local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
        local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] = lVar10 + 1;
        uVar2 = uVar9 + 1;
      } while (local_a8[uVar9] <= lVar10);
      bVar12 = uVar9 < uVar7;
    }
    if (!bVar12) {
      if (iVar5 == 0) {
        this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
        local_f0.pattern =
             (Pattern *)
             &local_f0.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"Greater than constraint is impossible to match","");
        LowlevelError::LowlevelError(this_01,(string *)&local_f0);
        __cxa_throw(this_01,&SleighError::typeinfo,LowlevelError::~LowlevelError);
      }
      if (local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (long *)0x0) {
        operator_delete(local_118.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_a8 != (long *)0x0) {
        operator_delete(local_a8);
      }
      if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void GreaterEquation::genPattern(const vector<TokenPattern> &ops) const

{
  intb lhsmin = lhs->minValue();
  intb lhsmax = lhs->maxValue();
  vector<const PatternValue *> semval;
  vector<intb> min;
  vector<intb> max;
  vector<intb> cur;
  int4 count=0;

  rhs->listValues(semval);
  rhs->getMinMax(min,max);
  cur = min;

  do {
    intb lhsval;
    intb val = rhs->getSubValue(cur);
    for(lhsval=lhsmin;lhsval<=lhsmax;++lhsval) {
      if (lhsval <= val) continue;
      if (count==0)
	resultpattern = buildPattern(lhs,lhsval,semval,cur);
      else
	resultpattern = resultpattern.doOr(buildPattern(lhs,lhsval,semval,cur));
      count += 1;
    }
  } while(advance_combo(cur,min,max));
  if (count == 0)
    throw SleighError("Greater than constraint is impossible to match");
}